

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::Clara::CommonArgProperties<Catch::ConfigData>::CommonArgProperties
          (CommonArgProperties<Catch::ConfigData> *this,
          CommonArgProperties<Catch::ConfigData> *param_1)

{
  pointer pcVar1;
  int iVar2;
  undefined4 extraout_var;
  IArgFunction<Catch::ConfigData> *pIVar3;
  
  pIVar3 = (param_1->boundField).functionObj;
  if (pIVar3 == (IArgFunction<Catch::ConfigData> *)0x0) {
    pIVar3 = (IArgFunction<Catch::ConfigData> *)0x0;
  }
  else {
    iVar2 = (*pIVar3->_vptr_IArgFunction[5])();
    pIVar3 = (IArgFunction<Catch::ConfigData> *)CONCAT44(extraout_var,iVar2);
  }
  (this->boundField).functionObj = pIVar3;
  (this->description)._M_dataplus._M_p = (pointer)&(this->description).field_2;
  pcVar1 = (param_1->description)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->description,pcVar1,pcVar1 + (param_1->description)._M_string_length);
  (this->detail)._M_dataplus._M_p = (pointer)&(this->detail).field_2;
  pcVar1 = (param_1->detail)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->detail,pcVar1,pcVar1 + (param_1->detail)._M_string_length);
  (this->placeholder)._M_dataplus._M_p = (pointer)&(this->placeholder).field_2;
  pcVar1 = (param_1->placeholder)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->placeholder,pcVar1,pcVar1 + (param_1->placeholder)._M_string_length);
  return;
}

Assistant:

CommonArgProperties() {}